

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O1

ON_wString __thiscall
ON_wString::FromYearMonthDayHourMinuteSecond
          (ON_wString *this,int year,int month,int mday,int hour,int minute,int second,
          ON_DateFormat date_format,ON_TimeFormat time_format,wchar_t date_separator,
          wchar_t date_time_separator,wchar_t time_separator)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  uint year_00;
  ulong uVar4;
  uint date;
  ulong uVar5;
  ulong uVar6;
  ON_wString *this_00;
  wchar_t ds [2];
  wchar_t ts [2];
  ON_wString *result;
  ON_wString local_78;
  ON_wString local_70;
  uint local_68;
  uint local_64;
  ON_wString local_60;
  wchar_t local_58 [3];
  undefined4 local_4c;
  ON_wString *local_48;
  wchar_t local_3c;
  wchar_t *local_38;
  
  uVar4 = (ulong)(uint)year;
  uVar3 = 0;
  if (year < 0x62e) {
    uVar4 = 0;
  }
  uVar5 = (ulong)(uint)mday;
  if (mday - 0x20U < 0xffffffe1) {
    uVar5 = 0;
  }
  if (month - 0xdU < 0xfffffff4) {
    month = uVar3;
  }
  uVar6 = (ulong)(uint)month;
  year_00 = (uint)uVar4;
  date = (uint)uVar5;
  local_68 = hour;
  local_64 = minute;
  local_48 = this;
  if (date_format == YearDayOfYear) {
    uVar3 = ON_DayOfGregorianYear(year_00,month,date);
  }
  local_58[0] = L'-';
  if (date_separator != L'\0') {
    local_58[0] = date_separator;
  }
  local_3c = L' ';
  if (date_time_separator != L'\0') {
    local_3c = date_time_separator;
  }
  local_58[2] = L':';
  if (time_separator != L'\0') {
    local_58[2] = time_separator;
  }
  if (date_format == YearDayOfYear) {
    bVar2 = 0 < (int)uVar3;
  }
  else {
    bVar2 = date != 0 && month != 0;
  }
  local_58[1] = 0;
  local_4c = 0;
  local_38 = L"AM";
  if (0xb < (int)local_68) {
    local_38 = L"PM";
  }
  ON_wString(&local_60);
  switch(date_format) {
  case Unset:
  case Omit:
    goto switchD_005c7a04_caseD_0;
  case YearMonthDay:
    FormatToString((wchar_t *)&local_78,L"%d%ls%d%ls%d",uVar4,local_58,uVar6,local_58,date);
    operator=(&local_60,&local_78);
    break;
  case YearDayMonth:
    FormatToString((wchar_t *)&local_78,L"%d%ls%d%ls%d",uVar4,local_58,uVar5,local_58,month);
    operator=(&local_60,&local_78);
    break;
  case MonthDayYear:
    FormatToString((wchar_t *)&local_78,L"%d%ls%d%ls%d",uVar6,local_58,uVar5,local_58,year_00);
    operator=(&local_60,&local_78);
    break;
  case DayMonthYear:
    FormatToString((wchar_t *)&local_78,L"%d%ls%d%ls%d",uVar5,local_58,uVar6,local_58,year_00);
    operator=(&local_60,&local_78);
    break;
  case YearDayOfYear:
    FormatToString((wchar_t *)&local_78,L"%d%ls%d",uVar4,local_58,(ulong)uVar3);
    operator=(&local_60,&local_78);
    break;
  default:
    goto switchD_005c7a04_default;
  }
  ~ON_wString(&local_78);
switchD_005c7a04_default:
  this_00 = local_48;
  if (bVar2) {
switchD_005c7a04_caseD_0:
    ON_wString(&local_78);
    this_00 = local_48;
    if (time_format - HourMinute12 < 4) {
      iVar1 = (int)local_68 >> 0x1f;
      switch(time_format) {
      case HourMinute12:
        FormatToString((wchar_t *)&local_70,L"%02d%ls%02d%ls",
                       (ulong)(local_68 + (((uint)((int)local_68 / 6 + iVar1) >> 1) - iVar1) * -0xc)
                       ,local_58 + 2,(ulong)local_64,local_38);
        operator=(&local_78,&local_70);
        break;
      case HourMinuteSecond12:
        FormatToString((wchar_t *)&local_70,L"%02d%ls%02d%ls%02d%ls",
                       (ulong)(local_68 + (((uint)((int)local_68 / 6 + iVar1) >> 1) - iVar1) * -0xc)
                       ,local_58 + 2,(ulong)local_64,local_58 + 2,second,local_38);
        operator=(&local_78,&local_70);
        break;
      case HourMinute24:
        FormatToString((wchar_t *)&local_70,L"%02d%ls%02d",(ulong)local_68,local_58 + 2,
                       (ulong)local_64);
        operator=(&local_78,&local_70);
        break;
      case HourMinuteSecond24:
        FormatToString((wchar_t *)&local_70,L"%02d%ls%02d%ls%02d",(ulong)local_68,local_58 + 2,
                       (ulong)local_64,local_58 + 2,second);
        operator=(&local_78,&local_70);
      }
      ~ON_wString(&local_70);
    }
    ON_wString(this_00,&local_60);
    bVar2 = IsNotEmpty(this_00);
    if ((bVar2) && (bVar2 = IsNotEmpty(&local_78), bVar2)) {
      local_70.m_s._0_4_ = local_3c;
      local_70.m_s._4_4_ = 0;
      operator+=(this_00,(wchar_t *)&local_70);
    }
    operator+=(this_00,&local_78);
    ~ON_wString(&local_78);
  }
  else {
    ON_wString(local_48,&EmptyString);
  }
  ~ON_wString(&local_60);
  return (ON_wString)(wchar_t *)this_00;
}

Assistant:

const ON_wString ON_wString::FromYearMonthDayHourMinuteSecond(
  int year,
  int month,
  int mday,
  int hour,
  int minute,
  int second,
  ON_DateFormat date_format,
  ON_TimeFormat time_format,
  wchar_t date_separator,
  wchar_t date_time_separator,
  wchar_t time_separator
)
{
  if (year < 1582)
    year = 0;

  if (mday < 1 || mday > 31)
    mday = 0;

  if (month < 1 || month > 12)
    month = 0;

  const int yday
    = (ON_DateFormat::YearDayOfYear == date_format)
    ? ON_DayOfGregorianYear(year, month, mday)
    : 0;

  if (0 == date_separator)
    date_separator = ON_wString::HyphenMinus;
  if (0 == date_time_separator)
    date_time_separator = ON_wString::Space;
  if (0 == time_separator)
    time_separator = ':';
  
  bool bValidDate 
    = ON_DateFormat::YearDayOfYear == date_format
    ? (yday > 0)
    : (month > 0 && mday > 0);
  bool bValidHMS = (hour >= 0 && minute >= 0 && second >= 0 && hour < 24 && minute <= 59 && second <= 59);


  const wchar_t ds[2] = { date_separator, 0 };
  const wchar_t ts[2] = { time_separator, 0 };
  const wchar_t* ampm = (hour >= 12) ? L"PM" : L"AM";
  
  ON_wString date;
  switch (date_format)
  {
  case ON_DateFormat::Unset:
    bValidDate = true;
    break;
  case ON_DateFormat::Omit:
    bValidDate = true;
    break;
  case ON_DateFormat::YearMonthDay:
    date = ON_wString::FormatToString(L"%d%ls%d%ls%d", year, ds, month, ds, mday);
    break;
  case ON_DateFormat::YearDayMonth:
    date = ON_wString::FormatToString(L"%d%ls%d%ls%d", year, ds, mday, ds, month);
    break;
  case ON_DateFormat::MonthDayYear:
    date = ON_wString::FormatToString(L"%d%ls%d%ls%d", month, ds, mday, ds, year);
    break;
  case ON_DateFormat::DayMonthYear:
    date = ON_wString::FormatToString(L"%d%ls%d%ls%d", mday, ds, month, ds, year);
    break;
  case ON_DateFormat::YearDayOfYear:
    date = ON_wString::FormatToString(L"%d%ls%d", year, ds, yday);
    break;
  default:
    break;
  }
  if (false == bValidDate)
    return ON_wString::EmptyString;
  
  ON_wString hms;
  switch (time_format)
  {
  case ON_TimeFormat::Unset:
    bValidHMS = true;
    break;
  case ON_TimeFormat::Omit:
    bValidHMS = true;
    break;
  case ON_TimeFormat::HourMinute12:
    hms = ON_wString::FormatToString(L"%02d%ls%02d%ls", hour%12, ts, minute, ampm);
    break;
  case ON_TimeFormat::HourMinuteSecond12:
    hms = ON_wString::FormatToString(L"%02d%ls%02d%ls%02d%ls", hour%12, ts, minute, ts, second, ampm);
    break;
  case ON_TimeFormat::HourMinute24:
    hms = ON_wString::FormatToString(L"%02d%ls%02d", hour, ts, minute);
    break;
  case ON_TimeFormat::HourMinuteSecond24:
    hms = ON_wString::FormatToString(L"%02d%ls%02d%ls%02d", hour, ts, minute, ts, second);
    break;
  default:
    break;
  }

  ON_wString result = date;
  if (result.IsNotEmpty() && hms.IsNotEmpty())
  {
    const wchar_t dts[] = { date_time_separator,0 };
    result += dts;
  }
  result += hms;

  return result;
}